

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_4dPoint * __thiscall ON_4dPoint::operator=(ON_4dPoint *this,double *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  
  if (p == (double *)0x0) {
    this->x = 0.0;
    this->y = 0.0;
    this->z = 0.0;
    uVar1 = 0;
    uVar2 = 0x3ff00000;
  }
  else {
    this->x = *p;
    this->y = p[1];
    this->z = p[2];
    uVar1 = SUB84(p[3],0);
    uVar2 = (undefined4)((ulong)p[3] >> 0x20);
  }
  this->w = (double)CONCAT44(uVar2,uVar1);
  return this;
}

Assistant:

ON_4dPoint& ON_4dPoint::operator=(const double* p)
{
  if ( p ) {
    x = p[0];
    y = p[1];
    z = p[2];
    w = p[3];
  }
  else {
    x = y = z = 0.0; w = 1.0;
  }
  return *this;
}